

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Erf::backward_impl
          (Erf *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Index index;
  ulong uVar5;
  Index index_1;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  Tensor::operator*(&local_50,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_70,dEdf);
  if ((local_50.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value !=
       local_70.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) ||
     (local_50.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value !=
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<cnn::scalar_erf_backward_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::scalar_erf_backward_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                 );
  }
  Tensor::operator*(&local_90,dEdxi);
  if ((local_90.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_70.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_90.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_70.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar2 = local_90.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_90.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
    uVar5 = uVar2;
    if ((((ulong)local_90.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar5 = (ulong)(-((uint)((ulong)local_90.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar2 <= (long)uVar5)) {
      uVar5 = uVar2;
    }
    uVar3 = uVar2 - uVar5;
    uVar6 = uVar3 + 0xf;
    if (-1 < (long)uVar3) {
      uVar6 = uVar3;
    }
    if (0 < (long)uVar5) {
      uVar4 = 0;
      do {
        auVar7._8_4_ = 0x80000000;
        auVar7._0_8_ = 0x8000000080000000;
        auVar7._12_4_ = 0x80000000;
        auVar7 = vxorps_avx512vl(ZEXT416((uint)local_50.
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                               .
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                               .m_data[uVar4]),auVar7);
        auVar8._0_4_ = expf(local_50.
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_data[uVar4] * auVar7._0_4_);
        auVar8._4_60_ = extraout_var;
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)(local_70.
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                .
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                .m_data[uVar4] * 1.1283792)),auVar8._0_16_,
                                 ZEXT416((uint)local_90.
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                               .
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                               .m_data[uVar4]));
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar4] = auVar7._0_4_;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    uVar6 = (uVar6 & 0xfffffffffffffff0) + uVar5;
    if (0xf < (long)uVar3) {
      auVar8 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar9 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar10 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar11 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar12 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar13 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar14 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar15 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar16 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar17 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar18 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar19 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar20 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      auVar21 = vbroadcastss_avx512f(ZEXT416(0x3f906ebb));
      do {
        auVar22 = vxorps_avx512dq(*(undefined1 (*) [64])
                                   (local_50.
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                    .
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                    .m_data + uVar5),auVar8);
        auVar22 = vmulps_avx512f(*(undefined1 (*) [64])
                                  (local_50.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   .m_data + uVar5),auVar22);
        auVar23 = vminps_avx512f(auVar22,auVar9);
        auVar23 = vmaxps_avx512f(auVar23,auVar10);
        auVar24 = vfmadd231ps_avx512f(auVar11,auVar23,auVar12);
        auVar24 = vrndscaleps_avx512f(auVar24,1);
        auVar23 = vfmadd231ps_avx512f(auVar23,auVar24,auVar13);
        auVar25 = vmulps_avx512f(auVar23,auVar23);
        auVar26 = vmulps_avx512f(auVar25,auVar23);
        auVar27 = vfmadd213ps_avx512f(auVar14,auVar23,auVar15);
        auVar28 = vfmadd213ps_avx512f(auVar16,auVar23,auVar17);
        auVar29 = vaddps_avx512f(auVar23,auVar18);
        auVar27 = vfmadd213ps_avx512f(auVar27,auVar23,auVar19);
        auVar23 = vfmadd213ps_avx512f(auVar28,auVar23,auVar11);
        auVar23 = vfmadd231ps_avx512f(auVar23,auVar26,auVar27);
        auVar23 = vfmadd213ps_avx512f(auVar23,auVar25,auVar29);
        auVar24 = vaddps_avx512f(auVar24,auVar20);
        auVar24 = vcvttps2dq_avx512f(auVar24);
        auVar24 = vpslld_avx512f(auVar24,0x17);
        auVar23 = vmulps_avx512f(auVar23,auVar24);
        auVar22 = vmaxps_avx512f(auVar22,auVar23);
        auVar23 = vmulps_avx512f(auVar21,*(undefined1 (*) [64])
                                          (local_70.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_data + uVar5));
        auVar22 = vfmadd213ps_avx512f(auVar23,auVar22,
                                      *(undefined1 (*) [64])
                                       (local_90.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data + uVar5));
        *(undefined1 (*) [64])
         (local_90.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar5) = auVar22;
        uVar5 = uVar5 + 0x10;
      } while ((long)uVar5 < (long)uVar6);
    }
    if ((long)uVar6 < (long)uVar2) {
      do {
        auVar1._8_4_ = 0x80000000;
        auVar1._0_8_ = 0x8000000080000000;
        auVar1._12_4_ = 0x80000000;
        auVar7 = vxorps_avx512vl(ZEXT416((uint)local_50.
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                               .
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                               .m_data[uVar6]),auVar1);
        auVar9._0_4_ = expf(local_50.
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_data[uVar6] * auVar7._0_4_);
        auVar9._4_60_ = extraout_var_00;
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)(local_70.
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                .
                                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                .m_data[uVar6] * 1.1283792)),auVar9._0_16_,
                                 ZEXT416((uint)local_90.
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                               .
                                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                               .m_data[uVar6]));
        local_90.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar6] = auVar7._0_4_;
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::scalar_erf_backward_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
               );
}

Assistant:

void Erf::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Erf not yet implemented for CUDA");
#else
  auto x = **xs[0];
  *dEdxi += x.binaryExpr(*dEdf, scalar_erf_backward_op<float>());
#endif
}